

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O3

string * __thiscall
wabt::operator+[abi_cxx11_(string *__return_storage_ptr__,wabt *this,char *x,string_view y)

{
  string *s;
  
  strlen((char *)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)this);
  std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)x);
  return __return_storage_ptr__;
}

Assistant:

inline std::string operator+(const char* x, string_view y) {
  return string_view(x) + y;
}